

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsdeviceintegration.cpp
# Opt level: O0

int __thiscall QEglFSDeviceIntegration::framebufferIndex(QEglFSDeviceIntegration *this)

{
  ulong uVar1;
  QRegularExpressionMatch *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  int fbIndex;
  QRegularExpressionMatch match;
  QFileInfo fbinfo;
  QRegularExpression fbIndexRx;
  undefined4 in_stack_fffffffffffffef8;
  MatchOption in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff08;
  QString *this_00;
  int local_e4;
  undefined1 local_d8 [8];
  QLatin1StringView in_stack_ffffffffffffff30;
  undefined4 local_bc;
  undefined1 local_b8 [24];
  QRegularExpressionMatch local_a0 [12];
  undefined4 local_94;
  undefined1 local_90 [24];
  QRegularExpressionMatch local_78 [8];
  undefined8 local_70;
  undefined1 local_68 [24];
  QString local_50;
  undefined8 local_38;
  uint local_2c;
  QString local_28;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_e4 = 0;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QVar2 = Qt::Literals::StringLiterals::operator____L1(in_stack_ffffffffffffff08,(size_t)in_RDI);
  this_00 = (QString *)QVar2.m_size;
  QString::QString((QString *)QVar2.m_data,in_stack_ffffffffffffff30);
  QFlags<QRegularExpression::PatternOption>::QFlags
            ((QFlags<QRegularExpression::PatternOption> *)in_RDI,in_stack_fffffffffffffefc);
  QRegularExpression::QRegularExpression
            ((QRegularExpression *)&local_10,&local_28,(QFlags_conflict *)(ulong)local_2c);
  QString::~QString((QString *)0x11816c);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)in_RDI + 0xe8))(local_68);
  QString::fromLocal8Bit<void>((QByteArray *)in_RDI);
  QFileInfo::QFileInfo((QFileInfo *)&local_38,&local_50);
  QString::~QString((QString *)0x1181c8);
  QByteArray::~QByteArray((QByteArray *)0x1181d5);
  local_70 = 0xaaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)&local_70);
  uVar1 = QFileInfo::isSymLink();
  if ((uVar1 & 1) == 0) {
    QFileInfo::fileName();
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_RDI,in_stack_fffffffffffffefc);
    QRegularExpression::match(local_a0,&local_10,local_b8,0,0,local_bc);
    QRegularExpressionMatch::operator=
              (in_RDI,(QRegularExpressionMatch *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QRegularExpressionMatch::~QRegularExpressionMatch(local_a0);
    QString::~QString((QString *)0x1182dd);
  }
  else {
    QFileInfo::symLinkTarget();
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_RDI,in_stack_fffffffffffffefc);
    QRegularExpression::match(local_78,&local_10,local_90,0,0,local_94);
    QRegularExpressionMatch::operator=
              (in_RDI,(QRegularExpressionMatch *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QRegularExpressionMatch::~QRegularExpressionMatch(local_78);
    QString::~QString((QString *)0x118274);
  }
  uVar1 = QRegularExpressionMatch::hasMatch();
  if ((uVar1 & 1) != 0) {
    QRegularExpressionMatch::captured((int)local_d8);
    local_e4 = QString::toInt(this_00,(bool *)in_RDI,in_stack_fffffffffffffefc);
    QString::~QString((QString *)0x118328);
  }
  QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_70);
  QFileInfo::~QFileInfo((QFileInfo *)&local_38);
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_e4;
}

Assistant:

int QEglFSDeviceIntegration::framebufferIndex() const
{
    int fbIndex = 0;
#if QT_CONFIG(regularexpression)
    QRegularExpression fbIndexRx("fb(\\d+)"_L1);
    QFileInfo fbinfo(QString::fromLocal8Bit(fbDeviceName()));
    QRegularExpressionMatch match;
    if (fbinfo.isSymLink())
        match = fbIndexRx.match(fbinfo.symLinkTarget());
    else
        match = fbIndexRx.match(fbinfo.fileName());
    if (match.hasMatch())
        fbIndex = match.captured(1).toInt();
#endif
    return fbIndex;
}